

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

void __thiscall IntegerType::IntegerType(IntegerType *this,IntegerType *other)

{
  (this->super_Type).kind = (other->super_Type).kind;
  (this->super_Type).isConst = false;
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__IntegerType_0017d930;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->unsignedType = other->unsignedType;
  return;
}

Assistant:

IntegerType::IntegerType(const IntegerType& other): Type(other.getKind()) {
    name = other.name;
    unsignedType = other.unsignedType;
}